

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall
QAbstractSpinBoxPrivate::setValue
          (QAbstractSpinBoxPrivate *this,QVariant *val,EmitPolicy ep,bool doUpdate)

{
  QWidget *this_00;
  char cVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_80;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_58,&this->value);
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_80 = 2;
  (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xb8))(&local_78,this,val,&local_98,0);
  ::QVariant::operator=(&this->value,&local_78);
  ::QVariant::~QVariant(&local_78);
  ::QVariant::~QVariant((QVariant *)&local_98);
  this->field_0x3d0 = this->field_0x3d0 & 0x7e;
  if ((int)CONCAT71(in_register_00000009,doUpdate) != 0) {
    (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xc0))(this);
  }
  QWidget::update(this_00);
  if (ep != AlwaysEmit) {
    if (ep != EmitIfChanged) goto LAB_004800ae;
    cVar1 = ::QVariant::equals((QVariant *)&local_58);
    if (cVar1 != '\0') goto LAB_004800ae;
  }
  (**(code **)(*(long *)&this->super_QWidgetPrivate + 200))(this,ep,&local_58);
LAB_004800ae:
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::setValue(const QVariant &val, EmitPolicy ep,
                                       bool doUpdate)
{
    Q_Q(QAbstractSpinBox);
    const QVariant old = value;
    value = bound(val);
    pendingEmit = false;
    cleared = false;
    if (doUpdate) {
        updateEdit();
    }
    q->update();

    if (ep == AlwaysEmit || (ep == EmitIfChanged && old != value)) {
        emitSignals(ep, old);
    }
}